

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

void __thiscall wasm::HeapType::HeapType(HeapType *this,Struct *struct_)

{
  HeapTypeInfo *this_00;
  HeapType HVar1;
  undefined8 local_28;
  
  this_00 = (HeapTypeInfo *)operator_new(0x50);
  anon_unknown_0::HeapTypeInfo::HeapTypeInfo(this_00,struct_);
  local_28 = this_00;
  HVar1 = anon_unknown_0::RecGroupStore::insert
                    ((RecGroupStore *)&stack0xffffffffffffffd8,
                     (unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                      *)struct_);
  this->id = (uintptr_t)HVar1;
  std::
  unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
  ::~unique_ptr((unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                 *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

HeapType::HeapType(const Struct& struct_) {
  new (this) HeapType(
    globalRecGroupStore.insert(std::make_unique<HeapTypeInfo>(struct_)));
}